

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filters.cpp
# Opt level: O2

BoxFilter * pbrt::BoxFilter::Create(ParameterDictionary *parameters,FileLoc *loc,Allocator alloc)

{
  int iVar1;
  undefined4 extraout_var;
  allocator<char> local_39;
  float local_38;
  float local_34;
  string local_30;
  BoxFilter *pBVar2;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"xradius",&local_39);
  local_34 = ParameterDictionary::GetOneFloat(parameters,&local_30,0.5);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"yradius",&local_39);
  local_38 = ParameterDictionary::GetOneFloat(parameters,&local_30,0.5);
  std::__cxx11::string::~string((string *)&local_30);
  iVar1 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,8,4);
  pBVar2 = (BoxFilter *)CONCAT44(extraout_var,iVar1);
  (pBVar2->radius).super_Tuple2<pbrt::Vector2,_float>.x = local_34;
  (pBVar2->radius).super_Tuple2<pbrt::Vector2,_float>.y = local_38;
  return pBVar2;
}

Assistant:

BoxFilter *BoxFilter::Create(const ParameterDictionary &parameters, const FileLoc *loc,
                             Allocator alloc) {
    Float xw = parameters.GetOneFloat("xradius", 0.5f);
    Float yw = parameters.GetOneFloat("yradius", 0.5f);
    return alloc.new_object<BoxFilter>(Vector2f(xw, yw));
}